

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# System.cpp
# Opt level: O3

bool higan::System::MakeDirIfNotExist(string *dir_path,bool loop_create)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  int *piVar4;
  byte bVar5;
  string *dir_path_00;
  undefined1 local_40 [8];
  string parent_path;
  
  if (dir_path->_M_string_length == 0) {
LAB_0010f835:
    bVar5 = 0;
  }
  else {
    iVar3 = mkdir((dir_path->_M_dataplus)._M_p,0x1e4);
    if (iVar3 == -1) {
      piVar4 = __errno_location();
      if (*piVar4 != 0x11) {
        if ((*piVar4 != 2) || (!loop_create)) goto LAB_0010f835;
        std::__cxx11::string::rfind((char)dir_path,0x2f);
        dir_path_00 = (string *)local_40;
        std::__cxx11::string::substr((ulong)dir_path_00,(ulong)dir_path);
        bVar1 = MakeDirIfNotExist(dir_path_00,false);
        if (bVar1) {
          bVar2 = MakeDirIfNotExist(dir_path,false);
          dir_path_00 = (string *)(ulong)bVar2;
        }
        bVar5 = (byte)dir_path_00;
        if (local_40 != (undefined1  [8])&parent_path._M_string_length) {
          operator_delete((void *)local_40,parent_path._M_string_length + 1);
        }
        if (bVar1) goto LAB_0010f838;
      }
    }
    bVar5 = 1;
  }
LAB_0010f838:
  return (bool)(bVar5 & 1);
}

Assistant:

bool System::MakeDirIfNotExist(const std::string& dir_path, bool loop_create)
{
	if (dir_path.empty())
	{
		return false;
	}

	int result = mkdir(dir_path.c_str(), S_IRWXU | S_IRGRP | S_IROTH);
	if (result == -1)
	{
		if (errno == EEXIST)
		{
			return true;
		}
		else if (errno == ENOENT)
		{
			if (!loop_create)
			{
				return false;
			}

			std::string parent_path = dir_path.substr(0, dir_path.find_last_of('/'));

			if (MakeDirIfNotExist(parent_path, false))
			{
				return MakeDirIfNotExist(dir_path, false);
			}
		}
		else
		{
			return false;
		}
	}

	return true;
}